

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_ecf33::SwiftCompilerShellCommand::configureAttribute
          (SwiftCompilerShellCommand *this,ConfigureContext *ctx,StringRef name,
          ArrayRef<llvm::StringRef> values)

{
  ArrayRef<llvm::StringRef> values_00;
  StringRef name_00;
  iterator pSVar1;
  iterator pSVar2;
  size_t sVar3;
  bool bVar4;
  bool local_411;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3d1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3d0;
  char *local_3b8 [2];
  void *local_3a8;
  size_t local_3a0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_391;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_390;
  char *local_378 [2];
  void *local_368;
  size_t local_360;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_351;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_350;
  char *local_338 [2];
  void *local_328;
  size_t local_320;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_311;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_310;
  char *local_2f8 [2];
  void *local_2e8;
  size_t local_2e0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2d0;
  char *local_2b8 [2];
  char *local_2a8;
  size_t local_2a0;
  ConfigureContext *local_298;
  ConfigureContext *ctx_local;
  SwiftCompilerShellCommand *this_local;
  ArrayRef<llvm::StringRef> values_local;
  StringRef name_local;
  void *local_240;
  size_t local_238;
  char *local_230;
  size_t local_228;
  char *local_220;
  size_t local_218;
  void *local_210;
  size_t local_208;
  char *local_200;
  size_t local_1f8;
  char *local_1f0;
  size_t local_1e8;
  void *local_1e0;
  size_t local_1d8;
  char *local_1d0;
  size_t local_1c8;
  char *local_1c0;
  size_t local_1b8;
  void *local_1b0;
  size_t local_1a8;
  char *local_1a0;
  size_t local_198;
  char *local_190;
  size_t local_188;
  char *local_180;
  size_t local_178;
  char **local_170;
  char *local_168;
  size_t local_160;
  void **local_158;
  char *local_150;
  size_t local_148;
  void **local_140;
  char *local_138;
  size_t local_130;
  void **local_128;
  char *local_120;
  size_t local_118;
  void **local_110;
  char *local_108;
  size_t local_100;
  size_t local_f8;
  char *local_f0;
  void *local_e8;
  int local_dc;
  size_t local_d8;
  char *local_d0;
  void *local_c8;
  int local_bc;
  size_t local_b8;
  char *local_b0;
  void *local_a8;
  int local_9c;
  size_t local_98;
  char *local_90;
  void *local_88;
  int local_7c;
  size_t local_78;
  char *local_70;
  char *local_68;
  int local_5c;
  char *local_58;
  char **local_50;
  char *local_48;
  char **local_40;
  char *local_38;
  char **local_30;
  char *local_28;
  char **local_20;
  char *local_18;
  char **local_10;
  
  values_local.Data = (StringRef *)values.Length;
  this_local = (SwiftCompilerShellCommand *)values.Data;
  sVar3 = name.Length;
  local_2a8 = name.Data;
  local_50 = local_2b8;
  local_58 = "sources";
  local_2b8[0] = "sources";
  local_2a0 = sVar3;
  local_298 = ctx;
  ctx_local = (ConfigureContext *)this;
  values_local.Length = (size_type)local_2a8;
  local_198 = strlen("sources");
  local_180 = local_2a8;
  local_178 = local_2a0;
  local_190 = local_2b8[0];
  local_1a0 = local_2b8[0];
  local_168 = local_2b8[0];
  local_170 = &local_180;
  local_411 = false;
  local_188 = local_198;
  local_160 = local_198;
  if (local_2a0 == local_198) {
    local_68 = local_2a8;
    local_70 = local_2b8[0];
    local_78 = local_198;
    if (local_198 == 0) {
      local_5c = 0;
    }
    else {
      local_5c = memcmp(local_2a8,local_2b8[0],local_198);
    }
    local_411 = local_5c == 0;
  }
  if (local_411) {
    pSVar1 = llvm::ArrayRef<llvm::StringRef>::begin((ArrayRef<llvm::StringRef> *)&this_local);
    pSVar2 = llvm::ArrayRef<llvm::StringRef>::end((ArrayRef<llvm::StringRef> *)&this_local);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_2d1);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    vector<llvm::StringRef_const*,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2d0,
               pSVar1,pSVar2,&local_2d1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->sourcesList,&local_2d0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2d0);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_2d1);
  }
  else {
    local_2e8 = (void *)values_local.Length;
    local_40 = local_2f8;
    local_48 = "objects";
    local_2f8[0] = "objects";
    local_2e0 = sVar3;
    local_1c8 = strlen("objects");
    local_1b0 = local_2e8;
    local_1a8 = local_2e0;
    local_1c0 = local_2f8[0];
    local_1d0 = local_2f8[0];
    local_150 = local_2f8[0];
    local_158 = &local_1b0;
    bVar4 = false;
    local_1b8 = local_1c8;
    local_148 = local_1c8;
    if (local_2e0 == local_1c8) {
      local_88 = local_2e8;
      local_90 = local_2f8[0];
      local_98 = local_1c8;
      if (local_1c8 == 0) {
        local_7c = 0;
      }
      else {
        local_7c = memcmp(local_2e8,local_2f8[0],local_1c8);
      }
      bVar4 = local_7c == 0;
    }
    if (bVar4) {
      pSVar1 = llvm::ArrayRef<llvm::StringRef>::begin((ArrayRef<llvm::StringRef> *)&this_local);
      pSVar2 = llvm::ArrayRef<llvm::StringRef>::end((ArrayRef<llvm::StringRef> *)&this_local);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_311);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<llvm::StringRef_const*,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_310,
                 pSVar1,pSVar2,&local_311);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=(&this->objectsList,&local_310);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_310);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_311);
    }
    else {
      local_328 = (void *)values_local.Length;
      local_30 = local_338;
      local_38 = "import-paths";
      local_338[0] = "import-paths";
      local_320 = sVar3;
      local_1f8 = strlen("import-paths");
      local_1e0 = local_328;
      local_1d8 = local_320;
      local_1f0 = local_338[0];
      local_200 = local_338[0];
      local_138 = local_338[0];
      local_140 = &local_1e0;
      bVar4 = false;
      local_1e8 = local_1f8;
      local_130 = local_1f8;
      if (local_320 == local_1f8) {
        local_a8 = local_328;
        local_b0 = local_338[0];
        local_b8 = local_1f8;
        if (local_1f8 == 0) {
          local_9c = 0;
        }
        else {
          local_9c = memcmp(local_328,local_338[0],local_1f8);
        }
        bVar4 = local_9c == 0;
      }
      if (bVar4) {
        pSVar1 = llvm::ArrayRef<llvm::StringRef>::begin((ArrayRef<llvm::StringRef> *)&this_local);
        pSVar2 = llvm::ArrayRef<llvm::StringRef>::end((ArrayRef<llvm::StringRef> *)&this_local);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator(&local_351);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<llvm::StringRef_const*,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_350,
                   pSVar1,pSVar2,&local_351);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&this->importPaths,&local_350);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_350);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator(&local_351);
      }
      else {
        local_368 = (void *)values_local.Length;
        local_20 = local_378;
        local_28 = "other-args";
        local_378[0] = "other-args";
        local_360 = sVar3;
        local_228 = strlen("other-args");
        local_210 = local_368;
        local_208 = local_360;
        local_220 = local_378[0];
        local_230 = local_378[0];
        local_120 = local_378[0];
        local_128 = &local_210;
        bVar4 = false;
        local_218 = local_228;
        local_118 = local_228;
        if (local_360 == local_228) {
          local_c8 = local_368;
          local_d0 = local_378[0];
          local_d8 = local_228;
          if (local_228 == 0) {
            local_bc = 0;
          }
          else {
            local_bc = memcmp(local_368,local_378[0],local_228);
          }
          bVar4 = local_bc == 0;
        }
        if (bVar4) {
          pSVar1 = llvm::ArrayRef<llvm::StringRef>::begin((ArrayRef<llvm::StringRef> *)&this_local);
          pSVar2 = llvm::ArrayRef<llvm::StringRef>::end((ArrayRef<llvm::StringRef> *)&this_local);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator(&local_391);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          vector<llvm::StringRef_const*,void>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_390
                     ,pSVar1,pSVar2,&local_391);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&this->otherArgs,&local_390);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_390);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator(&local_391);
        }
        else {
          local_3a8 = (void *)values_local.Length;
          local_10 = local_3b8;
          local_18 = "module-aliases";
          local_3b8[0] = "module-aliases";
          local_3a0 = sVar3;
          local_100 = strlen("module-aliases");
          local_240 = local_3a8;
          local_238 = local_3a0;
          local_108 = local_3b8[0];
          local_110 = &local_240;
          bVar4 = false;
          if (local_3a0 == local_100) {
            local_e8 = local_3a8;
            local_f0 = local_3b8[0];
            local_f8 = local_100;
            if (local_100 == 0) {
              local_dc = 0;
            }
            else {
              local_dc = memcmp(local_3a8,local_3b8[0],local_100);
            }
            bVar4 = local_dc == 0;
          }
          if (!bVar4) {
            name_00.Length = sVar3;
            name_00.Data = (char *)values_local.Length;
            values_00.Length = (size_type)values_local.Data;
            values_00.Data = (StringRef *)this_local;
            bVar4 = llbuild::buildsystem::ExternalCommand::configureAttribute
                              (&this->super_ExternalCommand,local_298,name_00,values_00);
            return bVar4;
          }
          pSVar1 = llvm::ArrayRef<llvm::StringRef>::begin((ArrayRef<llvm::StringRef> *)&this_local);
          pSVar2 = llvm::ArrayRef<llvm::StringRef>::end((ArrayRef<llvm::StringRef> *)&this_local);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::allocator(&local_3d1);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          vector<llvm::StringRef_const*,void>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3d0
                     ,pSVar1,pSVar2,&local_3d1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&this->moduleAliases,&local_3d0);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_3d0);
          std::
          allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~allocator(&local_3d1);
        }
      }
    }
  }
  return true;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  ArrayRef<StringRef> values) override {
    if (name == "sources") {
      sourcesList = std::vector<std::string>(values.begin(), values.end());
    } else if (name == "objects") {
      objectsList = std::vector<std::string>(values.begin(), values.end());
    } else if (name == "import-paths") {
      importPaths = std::vector<std::string>(values.begin(), values.end());
    } else if (name == "other-args") {
      otherArgs = std::vector<std::string>(values.begin(), values.end());
    } else if (name == "module-aliases") {
      moduleAliases = std::vector<std::string>(values.begin(), values.end());
    } else {
      return ExternalCommand::configureAttribute(ctx, name, values);
    }
    
    return true;
  }